

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCollisionWorldImporter.cpp
# Opt level: O0

btCollisionObject * __thiscall
btCollisionWorldImporter::createCollisionObject
          (btCollisionWorldImporter *this,btTransform *startTransform,btCollisionShape *shape,
          char *bodyName)

{
  btCollisionObject *ptr;
  btCollisionObject **value;
  long in_RCX;
  undefined8 in_RDX;
  btCollisionObject **in_RDI;
  char *newname;
  btCollisionObject *colObj;
  btTransform *in_stack_ffffffffffffff88;
  btCollisionObject *in_stack_ffffffffffffff90;
  btCollisionObject *this_00;
  btCollisionWorldImporter *in_stack_ffffffffffffffa8;
  btHashPtr local_48;
  btCollisionObject *in_stack_ffffffffffffffc0;
  btHashString *in_stack_ffffffffffffffc8;
  btHashMap<btHashString,_btCollisionObject_*> *in_stack_ffffffffffffffd0;
  
  ptr = (btCollisionObject *)btCollisionObject::operator_new(0x18732c);
  btCollisionObject::btCollisionObject(in_stack_ffffffffffffffc0);
  this_00 = ptr;
  btCollisionObject::setWorldTransform(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  (*ptr->_vptr_btCollisionObject[2])(ptr,in_RDX);
  (*in_RDI[1]->_vptr_btCollisionObject[9])(in_RDI[1],ptr,1,0xffffffff);
  if (in_RCX != 0) {
    value = (btCollisionObject **)duplicateName(in_stack_ffffffffffffffa8,(char *)this_00);
    btHashPtr::btHashPtr(&local_48,ptr);
    btHashMap<btHashPtr,_const_char_*>::insert
              ((btHashMap<btHashPtr,_const_char_*> *)in_stack_ffffffffffffffd0,
               (btHashPtr *)in_stack_ffffffffffffffc8,(char **)value);
    btHashString::btHashString((btHashString *)&stack0xffffffffffffffa8,(char *)value);
    btHashMap<btHashString,_btCollisionObject_*>::insert
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,value);
  }
  btAlignedObjectArray<btCollisionObject_*>::push_back
            ((btAlignedObjectArray<btCollisionObject_*> *)this_00,in_RDI);
  return ptr;
}

Assistant:

btCollisionObject* btCollisionWorldImporter::createCollisionObject(const btTransform& startTransform,btCollisionShape* shape, const char* bodyName)
{
	btCollisionObject* colObj = new btCollisionObject();
	colObj->setWorldTransform(startTransform);
	colObj->setCollisionShape(shape);
	m_collisionWorld->addCollisionObject(colObj);//todo: flags etc

	if (bodyName)
	{
		char* newname = duplicateName(bodyName);
		m_objectNameMap.insert(colObj,newname);
		m_nameColObjMap.insert(newname,colObj);
	}
	m_allocatedCollisionObjects.push_back(colObj);

	return colObj;
}